

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximpl.h
# Opt level: O1

bool __thiscall YAML::RegEx::Matches<YAML::StringCharSource>(RegEx *this,StringCharSource *source)

{
  RegEx *pRVar1;
  uint uVar2;
  uint uVar3;
  pointer pRVar4;
  RegEx *param;
  long lVar5;
  RegEx *pRVar6;
  ulong uVar7;
  
  uVar7 = source->m_offset;
  uVar2 = 0xffffffff;
  uVar3 = uVar2;
  if (source->m_size <= uVar7 && 0xfffffffd < this->m_op - REGEX_OR) goto switchD_00719e71_default;
  switch(this->m_op) {
  case REGEX_EMPTY:
    uVar3 = -(uint)(uVar7 < source->m_size);
    break;
  case REGEX_MATCH:
    uVar3 = (uint)(source->m_str[uVar7] == this->m_a) * 2 - 1;
    break;
  case REGEX_RANGE:
    uVar3 = -(uint)(this->m_z < source->m_str[uVar7] || source->m_str[uVar7] < this->m_a);
    goto LAB_00719f45;
  case REGEX_OR:
    pRVar6 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
             super__Vector_impl_data._M_start;
    pRVar1 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while ((uVar3 = uVar2, pRVar6 != pRVar1 &&
           (uVar3 = MatchUnchecked<YAML::StringCharSource>(pRVar6,source), (int)uVar3 < 0))) {
      pRVar6 = pRVar6 + 1;
    }
    break;
  case REGEX_AND:
    pRVar4 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
        super__Vector_impl_data._M_finish != pRVar4) {
      lVar5 = 0;
      uVar7 = 0;
      do {
        uVar2 = MatchUnchecked<YAML::StringCharSource>
                          ((RegEx *)((long)&pRVar4->m_op + lVar5),source);
        if (uVar2 == 0xffffffff) {
          uVar3 = 0xffffffff;
          break;
        }
        if (uVar7 == 0) {
          uVar3 = uVar2;
        }
        uVar7 = uVar7 + 1;
        pRVar4 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0x20;
      } while (uVar7 < (ulong)((long)(this->m_params).
                                     super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pRVar4 >> 5))
      ;
    }
    break;
  case REGEX_NOT:
    pRVar6 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pRVar6 == (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                  _M_impl.super__Vector_impl_data._M_finish) break;
    uVar3 = MatchUnchecked<YAML::StringCharSource>(pRVar6,source);
    uVar3 = (int)~uVar3 >> 0x1f;
LAB_00719f45:
    uVar3 = uVar3 | 1;
    break;
  case REGEX_SEQ:
    uVar3 = MatchOpSeq<YAML::StringCharSource>(this,source);
  }
switchD_00719e71_default:
  return -1 < (int)uVar3;
}

Assistant:

inline bool RegEx::Matches(const Source& source) const {
  return Match(source) >= 0;
}